

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::GetAllTestDependencies
          (cmCTestMultiProcessHandler *this,int test,TestList *dependencies)

{
  bool bVar1;
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  reference piVar2;
  int local_44;
  iterator iStack_40;
  int i;
  iterator __end1;
  iterator __begin1;
  TestSet *__range1;
  TestSet *dependencySet;
  TestList *dependencies_local;
  cmCTestMultiProcessHandler *pcStack_10;
  int test_local;
  cmCTestMultiProcessHandler *this_local;
  
  dependencies_local._4_4_ = test;
  pcStack_10 = this;
  this_00 = &std::
             map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
             ::operator[](&(this->Tests).
                           super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                          ,(key_type *)((long)&dependencies_local + 4))->
             super_set<int,_std::less<int>,_std::allocator<int>_>;
  __end1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(this_00);
  iStack_40 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&stack0xffffffffffffffc0);
    if (!bVar1) break;
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&__end1);
    local_44 = *piVar2;
    GetAllTestDependencies(this,local_44,dependencies);
    std::vector<int,_std::allocator<int>_>::push_back
              (&dependencies->super_vector<int,_std::allocator<int>_>,&local_44);
    std::_Rb_tree_const_iterator<int>::operator++(&__end1);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::GetAllTestDependencies(int test,
                                                        TestList& dependencies)
{
  TestSet const& dependencySet = this->Tests[test];
  for (int i : dependencySet) {
    this->GetAllTestDependencies(i, dependencies);
    dependencies.push_back(i);
  }
}